

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::pipeline::anon_unknown_0::createSamplerMinFilterTests
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,VkImageViewType imageViewType,
          VkFormat imageFormat)

{
  bool bVar1;
  TestCaseGroup *this;
  TestNode *pTVar2;
  TestNode *pTVar3;
  DefaultDeleter<tcu::TestCaseGroup> local_35 [20];
  undefined1 local_21;
  VkFormat local_20;
  VkImageViewType local_1c;
  VkFormat imageFormat_local;
  VkImageViewType imageViewType_local;
  TestContext *testCtx_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *samplerMinFilterTests;
  
  local_21 = 0;
  local_20 = imageFormat;
  local_1c = imageViewType;
  _imageFormat_local = testCtx;
  testCtx_local = (TestContext *)__return_storage_ptr__;
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (this,_imageFormat_local,"min_filter","Tests for minification filter");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_35);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            (__return_storage_ptr__,this);
  bVar1 = ::vk::isCompressedFormat(local_20);
  if ((bVar1) ||
     ((bVar1 = ::vk::isIntFormat(local_20), !bVar1 && (bVar1 = ::vk::isUintFormat(local_20), !bVar1)
      ))) {
    pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->(&__return_storage_ptr__->
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                        )->super_TestNode;
    pTVar3 = (TestNode *)operator_new(0x128);
    SamplerMinFilterTest::SamplerMinFilterTest
              ((SamplerMinFilterTest *)pTVar3,_imageFormat_local,"linear",
               "Minifies image using VK_TEX_FILTER_LINEAR",local_1c,local_20,VK_FILTER_LINEAR);
    tcu::TestNode::addChild(pTVar2,pTVar3);
  }
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->(&__return_storage_ptr__->
                        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                      )->super_TestNode;
  pTVar3 = (TestNode *)operator_new(0x128);
  SamplerMinFilterTest::SamplerMinFilterTest
            ((SamplerMinFilterTest *)pTVar3,_imageFormat_local,"nearest",
             "Minifies image using VK_TEX_FILTER_NEAREST",local_1c,local_20,VK_FILTER_NEAREST);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<tcu::TestCaseGroup> createSamplerMinFilterTests (tcu::TestContext& testCtx, VkImageViewType imageViewType, VkFormat imageFormat)
{
	MovePtr<tcu::TestCaseGroup> samplerMinFilterTests (new tcu::TestCaseGroup(testCtx, "min_filter", "Tests for minification filter"));

	if (isCompressedFormat(imageFormat) || (!isIntFormat(imageFormat) && !isUintFormat(imageFormat)))
		samplerMinFilterTests->addChild(new SamplerMinFilterTest(testCtx, "linear", "Minifies image using VK_TEX_FILTER_LINEAR", imageViewType, imageFormat, VK_FILTER_LINEAR));
	samplerMinFilterTests->addChild(new SamplerMinFilterTest(testCtx, "nearest", "Minifies image using VK_TEX_FILTER_NEAREST", imageViewType, imageFormat, VK_FILTER_NEAREST));

	return samplerMinFilterTests;
}